

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalserver_unix.cpp
# Opt level: O0

int __thiscall QLocalServerPrivate::listen(QLocalServerPrivate *this,int __fd,int __n)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  QObject *fullServerName;
  parameter_type pQVar4;
  QSocketNotifier *this_00;
  uint in_register_00000034;
  long in_FS_OFFSET;
  QLocalServer *q;
  SocketOptions options;
  socklen_t len;
  bool abstractAddress;
  sockaddr_un addr;
  parameter_type in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff58;
  undefined1 on;
  SocketOption flag;
  QLocalServerPrivate *addr_00;
  QObject local_88 [8];
  Int local_80;
  socklen_t local_7c;
  undefined1 local_77;
  sockaddr local_76 [6];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  addr_00 = this;
  fullServerName = &q_func(this)->super_QObject;
  this->listenSocket = __fd;
  fcntl(this->listenSocket,2,1);
  flag = this->listenSocket;
  uVar2 = fcntl(this->listenSocket,3);
  fcntl(flag,4,(ulong)(uVar2 | 0x800));
  local_77 = 0;
  memset(local_76,0xaa,0x6e);
  local_7c = 0x6e;
  memset(local_76,0,0x6e);
  iVar3 = getsockname(__fd,local_76,&local_7c);
  if (iVar3 == 0) {
    bVar1 = QLocalSocketPrivate::parseSockaddr
                      ((sockaddr_un *)addr_00,in_register_00000034,(QString *)fullServerName,
                       (QString *)CONCAT44(flag,in_stack_ffffffffffffff58),(bool *)this);
    on = (undefined1)((uint)in_stack_ffffffffffffff58 >> 0x18);
    if (bVar1) {
      local_80 = 0xaaaaaaaa;
      pQVar4 = QObjectBindableProperty<QLocalServerPrivate,_QFlags<QLocalServer::SocketOption>,_&QLocalServerPrivate::_qt_property_socketOptions_offset,_nullptr>
               ::value((QObjectBindableProperty<QLocalServerPrivate,_QFlags<QLocalServer::SocketOption>,_&QLocalServerPrivate::_qt_property_socketOptions_offset,_nullptr>
                        *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      local_80 = (pQVar4->super_QFlagsStorageHelper<QLocalServer::SocketOption,_4>).
                 super_QFlagsStorage<QLocalServer::SocketOption>.i;
      QFlags<QLocalServer::SocketOption>::setFlag
                ((QFlags<QLocalServer::SocketOption> *)fullServerName,flag,(bool)on);
      QObjectBindableProperty<QLocalServerPrivate,_QFlags<QLocalServer::SocketOption>,_&QLocalServerPrivate::_qt_property_socketOptions_offset,_nullptr>
      ::operator=((QObjectBindableProperty<QLocalServerPrivate,_QFlags<QLocalServer::SocketOption>,_&QLocalServerPrivate::_qt_property_socketOptions_offset,_nullptr>
                   *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                  in_stack_ffffffffffffff38);
    }
  }
  this_00 = (QSocketNotifier *)operator_new(0x10);
  QSocketNotifier::QSocketNotifier(this_00,(long)this->listenSocket,Read,fullServerName);
  this->socketNotifier = this_00;
  QObject::connect(local_88,(char *)this->socketNotifier,(QObject *)"2activated(QSocketDescriptor)",
                   (char *)fullServerName,0x3ea361);
  QMetaObject::Connection::~Connection((Connection *)local_88);
  QSocketNotifier::setEnabled(SUB81(this->socketNotifier,0));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (int)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),1);
}

Assistant:

bool QLocalServerPrivate::listen(qintptr socketDescriptor)
{
    Q_Q(QLocalServer);

    // Attach to the localsocket
    listenSocket = socketDescriptor;

    ::fcntl(listenSocket, F_SETFD, FD_CLOEXEC);
    ::fcntl(listenSocket, F_SETFL, ::fcntl(listenSocket, F_GETFL) | O_NONBLOCK);

    bool abstractAddress = false;
    struct ::sockaddr_un addr;
    QT_SOCKLEN_T len = sizeof(addr);
    memset(&addr, 0, sizeof(addr));
    if (::getsockname(socketDescriptor, (sockaddr *)&addr, &len) == 0) {
#if defined(Q_OS_QNX)
        if (addr.sun_path[0] == 0 && addr.sun_path[1] == 0)
            len = SUN_LEN(&addr);
#endif
        if (QLocalSocketPrivate::parseSockaddr(addr, len, fullServerName, serverName,
                                               abstractAddress)) {
            QLocalServer::SocketOptions options = socketOptions.value();
            socketOptions = options.setFlag(QLocalServer::AbstractNamespaceOption, abstractAddress);
        }
    }

    Q_ASSERT(!socketNotifier);
    socketNotifier = new QSocketNotifier(listenSocket,
                                         QSocketNotifier::Read, q);
    q->connect(socketNotifier, SIGNAL(activated(QSocketDescriptor)),
               q, SLOT(_q_onNewConnection()));
    socketNotifier->setEnabled(maxPendingConnections > 0);
    return true;
}